

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall Fl_Text_Buffer::remove(Fl_Text_Buffer *this,char *__filename)

{
  int extraout_EAX;
  char *deletedText;
  int in_EDX;
  int end;
  int iVar1;
  int nDeleted;
  
  iVar1 = (int)__filename;
  end = in_EDX;
  if (in_EDX < iVar1) {
    end = iVar1;
  }
  if (iVar1 < in_EDX) {
    in_EDX = iVar1;
  }
  iVar1 = this->mLength;
  if (iVar1 <= in_EDX) {
    in_EDX = iVar1;
  }
  if (in_EDX < 1) {
    in_EDX = 0;
  }
  if (iVar1 <= end) {
    end = iVar1;
  }
  if (end < 1) {
    end = 0;
  }
  nDeleted = end - in_EDX;
  if (nDeleted == 0) {
    return iVar1;
  }
  call_predelete_callbacks(this,in_EDX,nDeleted);
  deletedText = text_range(this,in_EDX,end);
  remove_(this,in_EDX,end);
  this->mCursorPosHint = in_EDX;
  call_modify_callbacks(this,in_EDX,nDeleted,0,0,deletedText);
  free(deletedText);
  return extraout_EAX;
}

Assistant:

void Fl_Text_Buffer::remove(int start, int end)
{
  /* Make sure the arguments make sense */
  if (start > end) {
    int temp = start;
    start = end;
    end = temp;
  }
  if (start > mLength)
    start = mLength;
  if (start < 0)
    start = 0;
  if (end > mLength)
    end = mLength;
  if (end < 0)
    end = 0;

  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))  
  
  if (start == end)
    return;
  
  call_predelete_callbacks(start, end - start);
  /* Remove and redisplay */
  const char *deletedText = text_range(start, end);
  remove_(start, end);
  mCursorPosHint = start;
  call_modify_callbacks(start, end - start, 0, 0, deletedText);
  free((void *) deletedText);
}